

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O0

void WebRtcIsac_AllPoleFilter(double *InOut,double *Coef,size_t lengthInOut,int orderCoef)

{
  double dVar1;
  int local_44;
  ulong uStack_40;
  int k;
  size_t n;
  double sum;
  double scal;
  int orderCoef_local;
  size_t lengthInOut_local;
  double *Coef_local;
  double *InOut_local;
  
  if ((*Coef <= 0.9999) || (1.0001 < *Coef || *Coef == 1.0001)) {
    dVar1 = *Coef;
    Coef_local = InOut;
    for (uStack_40 = 0; uStack_40 < lengthInOut; uStack_40 = uStack_40 + 1) {
      *Coef_local = (1.0 / dVar1) * *Coef_local;
      for (local_44 = 1; local_44 <= orderCoef; local_44 = local_44 + 1) {
        *Coef_local = -((1.0 / dVar1) * Coef[local_44]) * Coef_local[-local_44] + *Coef_local;
      }
      Coef_local = Coef_local + 1;
    }
  }
  else {
    Coef_local = InOut;
    for (uStack_40 = 0; uStack_40 < lengthInOut; uStack_40 = uStack_40 + 1) {
      n = (size_t)(Coef[1] * Coef_local[-1]);
      for (local_44 = 2; local_44 <= orderCoef; local_44 = local_44 + 1) {
        n = (size_t)(Coef[local_44] * Coef_local[-local_44] + (double)n);
      }
      *Coef_local = *Coef_local - (double)n;
      Coef_local = Coef_local + 1;
    }
  }
  return;
}

Assistant:

void WebRtcIsac_AllPoleFilter(double* InOut,
                              double* Coef,
                              size_t lengthInOut,
                              int orderCoef) {
  /* the state of filter is assumed to be in InOut[-1] to InOut[-orderCoef] */
  double scal;
  double sum;
  size_t n;
  int k;

  //if (fabs(Coef[0]-1.0)<0.001) {
  if ( (Coef[0] > 0.9999) && (Coef[0] < 1.0001) )
  {
    for(n = 0; n < lengthInOut; n++)
    {
      sum = Coef[1] * InOut[-1];
      for(k = 2; k <= orderCoef; k++){
        sum += Coef[k] * InOut[-k];
      }
      *InOut++ -= sum;
    }
  }
  else
  {
    scal = 1.0 / Coef[0];
    for(n=0;n<lengthInOut;n++)
    {
      *InOut *= scal;
      for(k=1;k<=orderCoef;k++){
        *InOut -= scal*Coef[k]*InOut[-k];
      }
      InOut++;
    }
  }
}